

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O2

FSerializer *
SerializePointer<side_t>(FSerializer *arc,char *key,side_t **value,side_t **defval,side_t *base)

{
  uint uVar1;
  side_t *psVar2;
  int64_t vv;
  
  if (base == (side_t *)0x0) {
    __assert_fail("base != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                  ,0x59f,
                  "FSerializer &SerializePointer(FSerializer &, const char *, T *&, T **, T *) [T = side_t]"
                 );
  }
  if (arc->r == (FReader *)0x0) {
    uVar1 = (arc->w->mInObject).Count;
    if (((uVar1 != 0) && (defval != (side_t **)0x0)) &&
       ((arc->w->mInObject).Array[uVar1 - 1] != false)) {
      psVar2 = *value;
      if (psVar2 == *defval) {
        return arc;
      }
      goto LAB_00474c55;
    }
  }
  psVar2 = *value;
LAB_00474c55:
  if (psVar2 == (side_t *)0x0) {
    vv = -1;
  }
  else {
    vv = ((long)psVar2 - (long)base) / 0xc0;
  }
  Serialize(arc,key,&vv,(int64_t *)0x0);
  psVar2 = base + vv;
  if (vv < 0) {
    psVar2 = (side_t *)0x0;
  }
  *value = psVar2;
  return arc;
}

Assistant:

FSerializer &SerializePointer(FSerializer &arc, const char *key, T *&value, T **defval, T *base)
{
	assert(base != nullptr);
	if (arc.isReading() || !arc.w->inObject() || defval == nullptr || value != *defval)
	{
		int64_t vv = value == nullptr ? -1 : value - base;
		Serialize(arc, key, vv, nullptr);
		value = vv < 0 ? nullptr : base + vv;
	}
	return arc;
}